

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-memory.c
# Opt level: O0

int run_test_get_memory(void)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  uint64_t constrained_mem;
  uint64_t total_mem;
  uint64_t free_mem;
  
  uVar1 = uv_get_free_memory();
  uVar2 = uv_get_total_memory();
  uVar3 = uv_get_constrained_memory();
  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu\n",uVar1,uVar2,uVar3);
  if (uVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-memory.c"
            ,0x27,"free_mem > 0");
    abort();
  }
  if (uVar2 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-memory.c"
            ,0x29,"total_mem > 0");
    abort();
  }
  if (uVar2 <= uVar1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-memory.c"
            ,0x2a,"total_mem > free_mem");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(get_memory) {
  uint64_t free_mem = uv_get_free_memory();
  uint64_t total_mem = uv_get_total_memory();
  uint64_t constrained_mem = uv_get_constrained_memory();

  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu\n",
         (unsigned long long) free_mem,
         (unsigned long long) total_mem,
         (unsigned long long) constrained_mem);

  /* On IBMi PASE, the amount of memory in use includes storage used for
   * memory and disks so it is possible to exceed the amount of main storage.
   */
#ifndef __PASE__
  ASSERT(free_mem > 0);
#endif
  ASSERT(total_mem > 0);
  ASSERT(total_mem > free_mem);

  return 0;
}